

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealToBitsFunction::~RealToBitsFunction(RealToBitsFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~RealToBitsFunction((RealToBitsFunction *)0x756ad8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit RealToBitsFunction(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::RealToBits, SubroutineKind::Function, 1,
                               {&builtins.realType}, builtins.ulongIntType, false) {}